

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O1

void __thiscall Assimp::ColladaExporter::WriteAnimationLibrary(ColladaExporter *this,size_t pIndex)

{
  pointer pbVar1;
  aiVectorKey *paVar2;
  aiQuatKey *paVar3;
  int iVar4;
  undefined8 *puVar5;
  ostream *poVar6;
  long *plVar7;
  size_t sVar8;
  size_type *psVar9;
  ulong *puVar10;
  aiNodeAnim *paVar11;
  aiAnimation *paVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  long lVar14;
  undefined8 uVar15;
  char *pcVar16;
  ulong uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  vector<float,_std::allocator<float>_> keyframes;
  string node_idstr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string idstrEscaped;
  string ending;
  string idstr;
  vector<float,_std::allocator<float>_> frames;
  string animation_name_escaped;
  string local_328;
  ostream *local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  float local_2dc;
  string local_2d8;
  undefined1 local_2b8 [40];
  float local_290;
  float local_28c;
  aiNodeAnim *local_288;
  float local_280;
  float local_27c;
  string *local_278;
  string local_270;
  aiAnimation *local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  float local_228;
  float local_224;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  char *local_200;
  undefined1 local_1f8 [8];
  undefined8 uStack_1f0;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  float local_1c8;
  float local_1c4;
  float local_1c0;
  float local_1bc;
  ios_base local_188 [272];
  ulong local_78;
  string local_70;
  string local_50;
  
  paVar12 = this->mScene->mAnimations[pIndex];
  if (((paVar12->mNumChannels == 0) && (paVar12->mNumMeshChannels == 0)) &&
     (paVar12->mNumMorphMeshChannels == 0)) {
    return;
  }
  pcVar16 = (paVar12->mName).data;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1f8,pcVar16,(allocator<char> *)&local_220);
  XMLEscape(&local_50,(string *)local_1f8);
  if (local_1f8 != (undefined1  [8])local_1e8) {
    operator_delete((void *)local_1f8,(long)local_1e8 + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,pcVar16,(allocator<char> *)local_1f8);
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"AnimId","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1f8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base(local_188);
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    uVar15 = local_270.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_2d8._M_string_length + local_270._M_string_length) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      uVar15 = local_2d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_2d8._M_string_length + local_270._M_string_length) goto LAB_00323157;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_2d8,0,(char *)0x0,(ulong)local_270._M_dataplus._M_p);
  }
  else {
LAB_00323157:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_2d8._M_dataplus._M_p);
  }
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  psVar9 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_248.field_2._M_allocated_capacity = *psVar9;
    local_248.field_2._8_8_ = puVar5[3];
  }
  else {
    local_248.field_2._M_allocated_capacity = *psVar9;
    local_248._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_248._M_string_length = puVar5[1];
  *puVar5 = psVar9;
  puVar5[1] = 0;
  *(undefined1 *)psVar9 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if (local_220._M_string_length < local_248._M_string_length) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                   &local_220,&local_248);
  }
  else {
    iVar4 = std::__cxx11::string::compare
                      ((ulong)&local_220,local_220._M_string_length - local_248._M_string_length,
                       (string *)local_248._M_string_length);
    if (iVar4 == 0) goto LAB_003232ae;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                   &local_220,&local_248);
  }
  std::__cxx11::string::operator=((string *)&local_220,(string *)local_1f8);
  if (local_1f8 != (undefined1  [8])local_1e8) {
    operator_delete((void *)local_1f8,(long)local_1e8 + 1);
  }
LAB_003232ae:
  XMLIDEncode(&local_270,&local_220);
  local_308 = (ostream *)&this->field_0x38;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_308,(this->startstr)._M_dataplus._M_p,(this->startstr)._M_string_length)
  ;
  std::operator+(&local_300,"<animation id=\"",&local_270);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_300);
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_328.field_2._M_allocated_capacity = *psVar9;
    local_328.field_2._8_8_ = plVar7[3];
  }
  else {
    local_328.field_2._M_allocated_capacity = *psVar9;
    local_328._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_328._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_328,(ulong)local_50._M_dataplus._M_p);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  puVar10 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_2d8.field_2._M_allocated_capacity = *puVar10;
    local_2d8.field_2._8_8_ = plVar7[3];
  }
  else {
    local_2d8.field_2._M_allocated_capacity = *puVar10;
    local_2d8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2d8._M_string_length = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  local_1f8 = (undefined1  [8])local_1e8;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar9) {
    local_1e8 = (undefined1  [8])*psVar9;
    _fStack_1e0 = plVar7[3];
  }
  else {
    local_1e8 = (undefined1  [8])*psVar9;
    local_1f8 = (undefined1  [8])*plVar7;
  }
  uStack_1f0 = (ai_real *)plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(char *)local_1f8,(long)uStack_1f0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  if (local_1f8 != (undefined1  [8])local_1e8) {
    operator_delete((void *)local_1f8,(long)local_1e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  local_278 = &this->startstr;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)local_278);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_allocated_capacity =
       local_2d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_250 = paVar12;
  if (paVar12->mNumChannels != 0) {
    uVar17 = 0;
    do {
      paVar11 = paVar12->mChannels[uVar17];
      if ((paVar11->mNumPositionKeys == paVar11->mNumScalingKeys) &&
         (paVar11->mNumPositionKeys == paVar11->mNumRotationKeys)) {
        local_2d8._M_string_length = 0;
        local_78 = uVar17;
        *local_2d8._M_dataplus._M_p = '\0';
        local_200 = (paVar11->mNodeName).data;
        local_288 = paVar11;
        std::__cxx11::string::append((char *)&local_2d8);
        local_1f8 = (undefined1  [8])local_1e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"_matrix-input","");
        std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_1f8);
        if (local_1f8 != (undefined1  [8])local_1e8) {
          operator_delete((void *)local_1f8,(long)local_1e8 + 1);
        }
        paVar11 = local_288;
        local_1f8 = (undefined1  [8])0x0;
        uStack_1f0 = (ai_real *)0x0;
        local_1e8 = (undefined1  [8])0x0;
        if (local_288->mNumPositionKeys != 0) {
          lVar14 = 0;
          uVar17 = 0;
          do {
            local_328._M_dataplus._M_p._0_4_ =
                 (float)*(double *)((long)&paVar11->mPositionKeys->mTime + lVar14);
            std::vector<float,_std::allocator<float>_>::emplace_back<float>
                      ((vector<float,_std::allocator<float>_> *)local_1f8,(float *)&local_328);
            uVar17 = uVar17 + 1;
            lVar14 = lVar14 + 0x18;
          } while (uVar17 < paVar11->mNumPositionKeys);
        }
        WriteFloatArray(this,&local_2d8,FloatType_Time,(ai_real *)local_1f8,
                        (long)uStack_1f0 - (long)local_1f8 >> 2);
        if ((undefined1  [8])uStack_1f0 != local_1f8) {
          uStack_1f0 = (ai_real *)local_1f8;
        }
        if (local_1f8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_1f8,(long)local_1e8 - (long)local_1f8);
        }
        local_2d8._M_string_length = 0;
        *local_2d8._M_dataplus._M_p = '\0';
        std::__cxx11::string::append((char *)&local_2d8);
        local_1f8 = (undefined1  [8])local_1e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"_matrix-output","");
        std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_1f8);
        if (local_1f8 != (undefined1  [8])local_1e8) {
          operator_delete((void *)local_1f8,(long)local_1e8 + 1);
        }
        local_328._M_dataplus._M_p = (pointer)0x0;
        local_328._M_string_length = 0;
        local_328.field_2._M_allocated_capacity = 0;
        std::vector<float,_std::allocator<float>_>::reserve
                  ((vector<float,_std::allocator<float>_> *)&local_328,
                   (ulong)(local_288->mNumPositionKeys << 4));
        if (local_288->mNumPositionKeys != 0) {
          uVar17 = 0;
          do {
            paVar2 = local_288->mPositionKeys;
            paVar3 = local_288->mRotationKeys;
            fVar28 = paVar3[uVar17].mValue.w;
            fVar18 = paVar3[uVar17].mValue.x;
            fVar20 = paVar3[uVar17].mValue.y;
            fVar19 = paVar3[uVar17].mValue.z;
            fVar24 = fVar20 * fVar20 + fVar19 * fVar19;
            fVar23 = 1.0 - (fVar24 + fVar24);
            fVar27 = fVar18 * fVar20 - fVar28 * fVar19;
            fVar27 = fVar27 + fVar27;
            fVar25 = fVar18 * fVar19 + fVar28 * fVar20;
            fVar25 = fVar25 + fVar25;
            fVar40 = fVar28 * fVar19 + fVar18 * fVar20;
            fVar40 = fVar40 + fVar40;
            fVar24 = fVar19 * fVar19 + fVar18 * fVar18;
            fVar32 = 1.0 - (fVar24 + fVar24);
            fVar31 = fVar19 * fVar20 - fVar28 * fVar18;
            fVar31 = fVar31 + fVar31;
            fVar34 = fVar18 * fVar19 - fVar28 * fVar20;
            fVar34 = fVar34 + fVar34;
            fVar26 = fVar19 * fVar20 + fVar28 * fVar18;
            fVar26 = fVar26 + fVar26;
            fVar28 = fVar18 * fVar18 + fVar20 * fVar20;
            fVar18 = 1.0 - (fVar28 + fVar28);
            fVar28 = paVar2[uVar17].mValue.x;
            fVar20 = fVar40 * 0.0;
            fVar21 = fVar34 * 0.0;
            fVar19 = fVar28 * 0.0;
            fVar30 = fVar23 + fVar20 + fVar21 + fVar19;
            fVar38 = fVar32 * 0.0;
            fVar22 = fVar26 * 0.0;
            fVar33 = fVar27 + fVar38 + fVar22 + fVar19;
            fVar29 = fVar31 * 0.0;
            fVar39 = fVar18 * 0.0;
            fVar19 = fVar25 + fVar29 + fVar39 + fVar19;
            fVar23 = fVar23 * 0.0;
            local_224 = paVar2[uVar17].mValue.y;
            fVar24 = local_224 * 0.0;
            fVar41 = fVar40 + fVar23 + fVar21 + fVar24;
            fVar27 = fVar27 * 0.0;
            fVar40 = fVar32 + fVar27 + fVar22 + fVar24;
            fVar25 = fVar25 * 0.0;
            fVar24 = fVar31 + fVar25 + fVar39 + fVar24;
            fVar23 = fVar23 + fVar20;
            fVar27 = fVar27 + fVar38;
            fVar25 = fVar25 + fVar29;
            local_27c = paVar2[uVar17].mValue.z;
            local_28c = local_27c * 0.0;
            fVar35 = fVar34 + fVar23 + local_28c;
            fVar26 = fVar26 + fVar27 + local_28c;
            local_28c = fVar18 + fVar25 + local_28c;
            paVar2 = local_288->mScalingKeys;
            fVar18 = paVar2[uVar17].mValue.y;
            fVar31 = fVar33 * 0.0;
            fVar20 = paVar2[uVar17].mValue.x;
            fVar29 = fVar30 * 0.0;
            fVar32 = fVar29 + fVar31;
            local_2dc = paVar2[uVar17].mValue.z;
            fVar38 = fVar19 * 0.0;
            fVar28 = fVar28 + 0.0;
            local_228 = fVar28 * 0.0;
            local_280 = fVar20 * fVar30 + fVar31 + fVar38 + local_228;
            local_290 = fVar18 * fVar33 + fVar29 + fVar38 + local_228;
            local_228 = local_2dc * fVar19 + fVar32 + local_228;
            fVar34 = fVar40 * 0.0;
            fVar42 = fVar41 * 0.0;
            fVar43 = fVar42 + fVar34;
            fVar33 = fVar24 * 0.0;
            fVar29 = (local_224 + 0.0) * 0.0;
            fVar19 = fVar26 * 0.0;
            fVar36 = fVar35 * 0.0;
            fVar37 = fVar36 + fVar19;
            fVar30 = local_28c * 0.0;
            local_1d8._12_4_ = fVar37 + fVar30 + local_27c + 0.0;
            fVar31 = (local_27c + 0.0) * 0.0;
            local_1d8._M_allocated_capacity._0_4_ = fVar20 * fVar35 + fVar19 + fVar30 + fVar31;
            local_1d8._M_allocated_capacity._4_4_ = fVar18 * fVar26 + fVar36 + fVar30 + fVar31;
            local_1d8._8_4_ = local_2dc * local_28c + fVar37 + fVar31;
            fVar19 = fVar23 + fVar21 + 0.0;
            fVar26 = fVar27 + fVar22 + 0.0;
            fVar27 = fVar26 * 0.0;
            fVar21 = fVar19 * 0.0;
            fVar22 = fVar21 + fVar27;
            fVar23 = fVar25 + fVar39 + 0.0;
            fVar25 = fVar23 * 0.0;
            local_1f8._4_4_ = local_290;
            local_1f8._0_4_ = local_280;
            uStack_1f0 = (ai_real *)CONCAT44(fVar32 + fVar38 + fVar28,local_228);
            local_1e8._4_4_ = fVar18 * fVar40 + fVar42 + fVar33 + fVar29;
            local_1e8._0_4_ = fVar20 * fVar41 + fVar34 + fVar33 + fVar29;
            fStack_1dc = fVar43 + fVar33 + local_224 + 0.0;
            fStack_1e0 = local_2dc * fVar24 + fVar43 + fVar29;
            local_1c8 = fVar20 * fVar19 + fVar27 + fVar25 + 0.0;
            local_1c4 = fVar18 * fVar26 + fVar21 + fVar25 + 0.0;
            local_1c0 = local_2dc * fVar23 + fVar22 + 0.0;
            local_1bc = fVar22 + fVar25 + 1.0;
            iVar4 = 0;
            pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8
            ;
            while( true ) {
              std::vector<float,std::allocator<float>>::_M_range_insert<float*>
                        ((vector<float,std::allocator<float>> *)&local_328,
                         local_328._M_string_length,pbVar13,&pbVar13->field_2);
              iVar4 = iVar4 + 1;
              if (iVar4 == 4) break;
              pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_1e8;
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 < local_288->mNumPositionKeys);
        }
        WriteFloatArray(this,&local_2d8,FloatType_Mat4x4,(ai_real *)local_328._M_dataplus._M_p,
                        (ulong)((long)(local_328._M_string_length - (long)local_328._M_dataplus._M_p
                                      ) >> 2) >> 4);
        if ((ai_real *)local_328._M_dataplus._M_p != (ai_real *)0x0) {
          operator_delete(local_328._M_dataplus._M_p,
                          local_328.field_2._M_allocated_capacity - (long)local_328._M_dataplus._M_p
                         );
        }
        local_2b8._0_8_ = (pointer)0x0;
        local_2b8._8_8_ = (pointer)0x0;
        local_2b8._16_8_ = (pointer)0x0;
        if (local_288->mNumPositionKeys != 0) {
          uVar17 = 0;
          paVar11 = local_288;
          do {
            if ((paVar11->mPreState < 4) && (paVar11->mPreState != aiAnimBehaviour_CONSTANT)) {
              local_1f8 = (undefined1  [8])local_1e8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"LINEAR","");
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_2b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f8);
LAB_00323e10:
              paVar11 = local_288;
              if (local_1f8 != (undefined1  [8])local_1e8) {
                operator_delete((void *)local_1f8,(long)local_1e8 + 1);
                paVar11 = local_288;
              }
            }
            else if (paVar11->mPostState == aiAnimBehaviour_CONSTANT) {
              local_1f8 = (undefined1  [8])local_1e8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"STEP","");
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_2b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f8);
              goto LAB_00323e10;
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 < paVar11->mNumPositionKeys);
        }
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_328,"_matrix-interpolation","");
        pcVar16 = local_200;
        strlen(local_200);
        plVar7 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_328,0,(char *)0x0,(ulong)pcVar16);
        local_1f8 = (undefined1  [8])local_1e8;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar9) {
          local_1e8 = (undefined1  [8])*psVar9;
          _fStack_1e0 = plVar7[3];
        }
        else {
          local_1e8 = (undefined1  [8])*psVar9;
          local_1f8 = (undefined1  [8])*plVar7;
        }
        uStack_1f0 = (ai_real *)plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        XMLIDEncode(&local_300,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_328,local_300._M_dataplus._M_p,
                   local_300._M_dataplus._M_p + local_300._M_string_length);
        std::__cxx11::string::append((char *)&local_328);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
        }
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_308,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<source id=\"",0xc);
        XMLIDEncode(&local_300,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_300._M_dataplus._M_p,local_300._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\">",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)local_278);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_308,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<Name_array id=\"",0x10);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_328._M_dataplus._M_p,local_328._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" count=\"",9);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"> ",3);
        if (local_2b8._8_8_ != local_2b8._0_8_) {
          lVar14 = 8;
          uVar17 = 0;
          do {
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_308,*(char **)(local_2b8._0_8_ + lVar14 + -8),
                                *(long *)(local_2b8._0_8_ + lVar14));
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            uVar17 = uVar17 + 1;
            lVar14 = lVar14 + 0x20;
          } while (uVar17 < (ulong)((long)(local_2b8._8_8_ - local_2b8._0_8_) >> 5));
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_308,"</Name_array>",0xd);
        paVar12 = local_250;
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_308,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_308,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<technique_common>",0x12);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)local_278);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_308,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<accessor source=\"#",0x13);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_328._M_dataplus._M_p,local_328._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" count=\"",9);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" stride=\"",10);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\">",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)local_278);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_308,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"<param name=\"INTERPOLATION\" type=\"name\"></param>",0x30);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_308,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"</accessor>",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_308,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"</technique_common>",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_308,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"</source>",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        if (local_1f8 != (undefined1  [8])local_1e8) {
          operator_delete((void *)local_1f8,(long)local_1e8 + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2b8);
        uVar17 = local_78;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < paVar12->mNumChannels);
  }
  if (paVar12->mNumChannels != 0) {
    pbVar1 = (pointer)(local_2b8 + 0x10);
    uVar17 = 0;
    do {
      paVar11 = paVar12->mChannels[uVar17];
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"_matrix-sampler","");
      pcVar16 = (paVar11->mNodeName).data;
      strlen(pcVar16);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_328,0,(char *)0x0,(ulong)pcVar16)
      ;
      local_1f8 = (undefined1  [8])local_1e8;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar9) {
        local_1e8 = (undefined1  [8])*psVar9;
        _fStack_1e0 = plVar7[3];
      }
      else {
        local_1e8 = (undefined1  [8])*psVar9;
        local_1f8 = (undefined1  [8])*plVar7;
      }
      uStack_1f0 = (ai_real *)plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_308,(this->startstr)._M_dataplus._M_p,
                          (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<sampler id=\"",0xd);
      XMLIDEncode(&local_328,(string *)local_1f8);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_328._M_dataplus._M_p,local_328._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\">",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)local_278);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_308,(this->startstr)._M_dataplus._M_p,
                          (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"<input semantic=\"INPUT\" source=\"#",0x21);
      local_2b8._0_8_ = pbVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"_matrix-input","");
      strlen(pcVar16);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_2b8,0,(char *)0x0,(ulong)pcVar16);
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_300.field_2._M_allocated_capacity = *psVar9;
        local_300.field_2._8_8_ = plVar7[3];
      }
      else {
        local_300.field_2._M_allocated_capacity = *psVar9;
        local_300._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_300._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      XMLIDEncode(&local_328,&local_300);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_328._M_dataplus._M_p,local_328._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"/>",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_2b8._0_8_ != pbVar1) {
        operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_308,(this->startstr)._M_dataplus._M_p,
                          (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"<input semantic=\"OUTPUT\" source=\"#",0x22);
      local_2b8._0_8_ = pbVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"_matrix-output","");
      strlen(pcVar16);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_2b8,0,(char *)0x0,(ulong)pcVar16);
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_300.field_2._M_allocated_capacity = *psVar9;
        local_300.field_2._8_8_ = plVar7[3];
      }
      else {
        local_300.field_2._M_allocated_capacity = *psVar9;
        local_300._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_300._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      XMLIDEncode(&local_328,&local_300);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_328._M_dataplus._M_p,local_328._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"/>",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_2b8._0_8_ != pbVar1) {
        operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_308,(this->startstr)._M_dataplus._M_p,
                          (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"<input semantic=\"INTERPOLATION\" source=\"#",0x29);
      local_2b8._0_8_ = pbVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2b8,"_matrix-interpolation","");
      strlen(pcVar16);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_2b8,0,(char *)0x0,(ulong)pcVar16);
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_300.field_2._M_allocated_capacity = *psVar9;
        local_300.field_2._8_8_ = plVar7[3];
      }
      else {
        local_300.field_2._M_allocated_capacity = *psVar9;
        local_300._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_300._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      XMLIDEncode(&local_328,&local_300);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_328._M_dataplus._M_p,local_328._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"/>",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_2b8._0_8_ != pbVar1) {
        operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
      }
      PopTag(this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_308,(this->startstr)._M_dataplus._M_p,
                          (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"</sampler>",10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      if (local_1f8 != (undefined1  [8])local_1e8) {
        operator_delete((void *)local_1f8,(long)local_1e8 + 1);
      }
      uVar17 = uVar17 + 1;
      paVar12 = local_250;
    } while (uVar17 < local_250->mNumChannels);
  }
  if (paVar12->mNumChannels != 0) {
    uVar17 = 0;
    do {
      paVar11 = paVar12->mChannels[uVar17];
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_308,(this->startstr)._M_dataplus._M_p,
                          (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<channel source=\"#",0x12);
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"_matrix-sampler","");
      pcVar16 = (paVar11->mNodeName).data;
      strlen(pcVar16);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,(ulong)pcVar16)
      ;
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_328.field_2._M_allocated_capacity = *psVar9;
        local_328.field_2._8_8_ = plVar7[3];
      }
      else {
        local_328.field_2._M_allocated_capacity = *psVar9;
        local_328._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_328._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      XMLIDEncode((string *)local_1f8,&local_328);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_1f8,(long)uStack_1f0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" target=\"",10);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      sVar8 = strlen(pcVar16);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar16,pcVar16 + sVar8);
      XMLIDEncode((string *)local_2b8,&local_70);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_2b8._0_8_,local_2b8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"/matrix\"/>",10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      if ((pointer)local_2b8._0_8_ != (pointer)(local_2b8 + 0x10)) {
        operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8 != (undefined1  [8])local_1e8) {
        operator_delete((void *)local_1f8,(long)local_1e8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      uVar17 = uVar17 + 1;
      paVar12 = local_250;
    } while (uVar17 < local_250->mNumChannels);
  }
  PopTag(this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_308,(this->startstr)._M_dataplus._M_p,(this->startstr)._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"</animation>",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ColladaExporter::WriteAnimationLibrary(size_t pIndex)
{
	const aiAnimation * anim = mScene->mAnimations[pIndex];
	
	if ( anim->mNumChannels == 0 && anim->mNumMeshChannels == 0 && anim->mNumMorphMeshChannels ==0 )
		return;
	
	const std::string animation_name_escaped = XMLEscape( anim->mName.C_Str() );
	std::string idstr = anim->mName.C_Str();
	std::string ending = std::string( "AnimId" ) + to_string(pIndex);
	if (idstr.length() >= ending.length()) {
		if (0 != idstr.compare (idstr.length() - ending.length(), ending.length(), ending)) {
			idstr = idstr + ending;
		}
	} else {
		idstr = idstr + ending;
	}

	const std::string idstrEscaped = XMLIDEncode(idstr);
	
	mOutput << startstr << "<animation id=\"" + idstrEscaped + "\" name=\"" + animation_name_escaped + "\">" << endstr;
	PushTag();

    std::string node_idstr;
	for (size_t a = 0; a < anim->mNumChannels; ++a) {
		const aiNodeAnim * nodeAnim = anim->mChannels[a];
		
		// sanity check
		if ( nodeAnim->mNumPositionKeys != nodeAnim->mNumScalingKeys ||  nodeAnim->mNumPositionKeys != nodeAnim->mNumRotationKeys ) continue;
		
		{
            node_idstr.clear();
            node_idstr += nodeAnim->mNodeName.data;
            node_idstr += std::string( "_matrix-input" );

			std::vector<ai_real> frames;
			for( size_t i = 0; i < nodeAnim->mNumPositionKeys; ++i) {
				frames.push_back(static_cast<ai_real>(nodeAnim->mPositionKeys[i].mTime));
			}
			
			WriteFloatArray( node_idstr , FloatType_Time, (const ai_real*) frames.data(), frames.size());
			frames.clear();
		}
		
		{
            node_idstr.clear();

            node_idstr += nodeAnim->mNodeName.data;
            node_idstr += std::string("_matrix-output");
			
			std::vector<ai_real> keyframes;
			keyframes.reserve(nodeAnim->mNumPositionKeys * 16);
			for( size_t i = 0; i < nodeAnim->mNumPositionKeys; ++i) {
				aiVector3D Scaling = nodeAnim->mScalingKeys[i].mValue;
				aiMatrix4x4 ScalingM;  // identity
				ScalingM[0][0] = Scaling.x; ScalingM[1][1] = Scaling.y; ScalingM[2][2] = Scaling.z;
				
				aiQuaternion RotationQ = nodeAnim->mRotationKeys[i].mValue;
				aiMatrix4x4 s = aiMatrix4x4( RotationQ.GetMatrix() );
				aiMatrix4x4 RotationM(s.a1, s.a2, s.a3, 0, s.b1, s.b2, s.b3, 0, s.c1, s.c2, s.c3, 0, 0, 0, 0, 1);
				
				aiVector3D Translation = nodeAnim->mPositionKeys[i].mValue;
				aiMatrix4x4 TranslationM;	// identity
				TranslationM[0][3] = Translation.x; TranslationM[1][3] = Translation.y; TranslationM[2][3] = Translation.z;
				
				// Combine the above transformations
				aiMatrix4x4 mat = TranslationM * RotationM * ScalingM;
				
				for( unsigned int j = 0; j < 4; ++j) {
					keyframes.insert(keyframes.end(), mat[j], mat[j] + 4);
                }
			}
			
			WriteFloatArray( node_idstr, FloatType_Mat4x4, (const ai_real*) keyframes.data(), keyframes.size() / 16);
		}
		
		{
			std::vector<std::string> names;
			for ( size_t i = 0; i < nodeAnim->mNumPositionKeys; ++i) {
				if ( nodeAnim->mPreState == aiAnimBehaviour_DEFAULT
					|| nodeAnim->mPreState == aiAnimBehaviour_LINEAR
					|| nodeAnim->mPreState == aiAnimBehaviour_REPEAT
					) {
					names.push_back( "LINEAR" );
				} else if (nodeAnim->mPostState == aiAnimBehaviour_CONSTANT) {
					names.push_back( "STEP" );
				}
			}
			
			const std::string node_idstr = nodeAnim->mNodeName.data + std::string("_matrix-interpolation");
            std::string arrayId = XMLIDEncode(node_idstr) + "-array";
			
			mOutput << startstr << "<source id=\"" << XMLIDEncode(node_idstr) << "\">" << endstr;
			PushTag();
			
			// source array
			mOutput << startstr << "<Name_array id=\"" << arrayId << "\" count=\"" << names.size() << "\"> ";
			for( size_t a = 0; a < names.size(); ++a ) {
				mOutput << names[a] << " ";
            }
			mOutput << "</Name_array>" << endstr;
			
			mOutput << startstr << "<technique_common>" << endstr;
			PushTag();

			mOutput << startstr << "<accessor source=\"#" << arrayId << "\" count=\"" << names.size() << "\" stride=\"" << 1 << "\">" << endstr;
			PushTag();
			
			mOutput << startstr << "<param name=\"INTERPOLATION\" type=\"name\"></param>" << endstr;
			
			PopTag();
			mOutput << startstr << "</accessor>" << endstr;
			
			PopTag();
			mOutput << startstr << "</technique_common>" << endstr;

			PopTag();
			mOutput << startstr << "</source>" << endstr;
		}
	}
	
	for (size_t a = 0; a < anim->mNumChannels; ++a) {
		const aiNodeAnim * nodeAnim = anim->mChannels[a];
		
		{
		// samplers
			const std::string node_idstr = nodeAnim->mNodeName.data + std::string("_matrix-sampler");
			mOutput << startstr << "<sampler id=\"" << XMLIDEncode(node_idstr) << "\">" << endstr;
			PushTag();
			
			mOutput << startstr << "<input semantic=\"INPUT\" source=\"#" << XMLIDEncode( nodeAnim->mNodeName.data + std::string("_matrix-input") ) << "\"/>" << endstr;
			mOutput << startstr << "<input semantic=\"OUTPUT\" source=\"#" << XMLIDEncode( nodeAnim->mNodeName.data + std::string("_matrix-output") ) << "\"/>" << endstr;
			mOutput << startstr << "<input semantic=\"INTERPOLATION\" source=\"#" << XMLIDEncode( nodeAnim->mNodeName.data + std::string("_matrix-interpolation") ) << "\"/>" << endstr;
			
			PopTag();
			mOutput << startstr << "</sampler>" << endstr;
		}
	}
	
	for (size_t a = 0; a < anim->mNumChannels; ++a) {
		const aiNodeAnim * nodeAnim = anim->mChannels[a];
		
		{
		// channels
			mOutput << startstr << "<channel source=\"#" << XMLIDEncode( nodeAnim->mNodeName.data + std::string("_matrix-sampler") ) << "\" target=\"" << XMLIDEncode(nodeAnim->mNodeName.data) << "/matrix\"/>" << endstr;
		}
	}
	
	PopTag();
	mOutput << startstr << "</animation>" << endstr;
	
}